

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,double&,double&>
          (pybind11 *this,double *args_,double *args__1)

{
  undefined8 uVar1;
  runtime_error *this_00;
  long *plVar2;
  object *poVar3;
  long *plVar4;
  long lVar5;
  array<pybind11::object,_2UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  object local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [2];
  
  poVar3 = local_b8;
  local_b8[0].super_handle.m_ptr = (handle)PyFloat_FromDouble(SUB84(*args_,0));
  local_b8[1].super_handle.m_ptr = (handle)PyFloat_FromDouble(SUB84(*args__1,0));
  lVar5 = 0;
  do {
    if (*(long *)poVar3 == 0) {
      type_id<double&>();
      type_id<double&>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_88,"make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_68 - lVar5));
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_a8 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_a8 == plVar4) {
        local_98 = *plVar4;
        lStack_90 = plVar2[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar4;
      }
      local_a0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_a8);
      *(undefined ***)this_00 = &PTR__runtime_error_001abd80;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar5 = lVar5 + -0x20;
    poVar3 = (object *)((long *)poVar3 + 1);
  } while (lVar5 == -0x20);
  tuple::tuple((tuple *)this,2);
  lVar5 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_b8[0].super_handle.m_ptr + lVar5);
    *(undefined8 *)((long)&local_b8[0].super_handle.m_ptr + lVar5) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                    ,0x6ee,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <double &, double &>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar5) = uVar1;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  lVar5 = 8;
  do {
    object::~object((object *)((long)&local_b8[0].super_handle.m_ptr + lVar5));
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}